

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

ContextInfo * glu::ContextInfo::create(RenderContext *context)

{
  bool bVar1;
  ApiType other;
  ES2ContextInfo *this;
  ContextInfo *this_00;
  ContextType local_20;
  ApiType local_1c;
  RenderContext *local_18;
  RenderContext *context_local;
  
  local_18 = context;
  local_20.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])();
  local_1c = ContextType::getAPI(&local_20);
  other = ApiType::es(2,0);
  bVar1 = ApiType::operator==(&local_1c,other);
  if (bVar1) {
    this = (ES2ContextInfo *)operator_new(0xe0);
    ES2ContextInfo::ES2ContextInfo(this,local_18);
    context_local = (RenderContext *)this;
  }
  else {
    this_00 = (ContextInfo *)operator_new(0x68);
    ContextInfo(this_00,local_18);
    context_local = (RenderContext *)this_00;
  }
  return (ContextInfo *)context_local;
}

Assistant:

ContextInfo* ContextInfo::create (const RenderContext& context)
{
	// ES2 uses special variant that checks support for various shader features
	// by trying to compile shader programs.
	if (context.getType().getAPI() == ApiType::es(2,0))
		return new ES2ContextInfo(context);

	return new ContextInfo(context);
}